

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::SamplesBufferSizeCase::test(SamplesBufferSizeCase *this)

{
  GLenum internalformat;
  bool bVar1;
  qpTestResult qVar2;
  int *params;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1a0;
  GLint local_20;
  undefined1 local_1c [4];
  GLint queryTargetValue;
  StateQueryMemoryWriteGuard<int> sampleCounts;
  SamplesBufferSizeCase *this_local;
  
  sampleCounts._4_8_ = this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_1c);
  internalformat = this->m_internalFormat;
  params = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_1c);
  glu::CallLogWrapper::glGetInternalformativ
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,internalformat,0x9380,1,params);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_1c,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar1) {
    local_20 = -1;
    glu::CallLogWrapper::glGetInternalformativ
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,this->m_internalFormat,0x9380,0,
               &local_20);
    ApiCase::expectError(&this->super_ApiCase,0);
    if (local_20 != -1) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
      tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_1a0,
                           (char (*) [57])"// ERROR: Expected output variable not to be written to."
                          );
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a0);
      qVar2 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got invalid write");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		StateQueryMemoryWriteGuard<GLint> sampleCounts;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCounts);
		expectError(GL_NO_ERROR);

		if (!sampleCounts.verifyValidity(m_testCtx))
			return;

		// test with bufSize = 0
		GLint queryTargetValue = -1;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 0, &queryTargetValue);
		expectError(GL_NO_ERROR);

		if (queryTargetValue != -1)
		{
			m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected output variable not to be written to." << TestLog::EndMessage;
			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid write");
		}
	}